

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_basics.cpp
# Opt level: O3

void test_1d_static<30ul>(void)

{
  int dptr [30];
  uint local_bc;
  bool *local_b8;
  bool *local_b0;
  bool local_a8 [120];
  
  local_a8[0] = true;
  local_b8 = (bool *)CONCAT71(local_b8._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x1d,"void test_1d_static() [X = 30UL]",local_a8,(bool *)&local_b8);
  local_a8[0] = true;
  local_a8[1] = false;
  local_a8[2] = false;
  local_a8[3] = false;
  local_a8[4] = false;
  local_a8[5] = false;
  local_a8[6] = false;
  local_a8[7] = false;
  local_b8 = (bool *)CONCAT44(local_b8._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x1f,"void test_1d_static() [X = 30UL]",(unsigned_long *)local_a8,(int *)&local_b8);
  local_a8[0] = true;
  local_a8[1] = false;
  local_a8[2] = false;
  local_a8[3] = false;
  local_a8[4] = false;
  local_a8[5] = false;
  local_a8[6] = false;
  local_a8[7] = false;
  local_b8 = (bool *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x21,"void test_1d_static() [X = 30UL]",(unsigned_long *)local_a8,
             (unsigned_long *)&local_b8);
  local_a8[0] = true;
  local_a8[1] = false;
  local_a8[2] = false;
  local_a8[3] = false;
  local_a8[4] = false;
  local_a8[5] = false;
  local_a8[6] = false;
  local_a8[7] = false;
  local_b8 = (bool *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x22,"void test_1d_static() [X = 30UL]",(unsigned_long *)local_a8,
             (unsigned_long *)&local_b8);
  local_bc = 0;
  do {
    local_b8 = (bool *)(ulong)local_bc;
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x29,"void test_1d_static() [X = 30UL]",(unsigned_long *)&local_b8,(int *)&local_bc)
    ;
    local_b8 = local_a8 + (long)(int)local_bc * 4;
    local_b0 = local_b8;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i)])","&(dptr[i])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x2b,"void test_1d_static() [X = 30UL]",(int **)&local_b8,(int **)&local_b0);
    *(uint *)(local_a8 + (long)(int)local_bc * 4) = local_bc;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i)])","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x2f,"void test_1d_static() [X = 30UL]",(int *)(local_a8 + (long)(int)local_bc * 4),
               (int *)&local_bc);
    local_bc = local_bc + 1;
  } while (local_bc < 0x1e);
  return;
}

Assistant:

void test_1d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X>, dimensions<1>, dimensions<0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.size()), X);
    BOOST_TEST_EQ((l.span()), X);

    int dptr[X];

    // Set all elements to a unique value.
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        BOOST_TEST_EQ(&(dptr[l.index(i)]), &(dptr[i])); 

        dptr[l.index(i)] = i;

        BOOST_TEST_EQ((dptr[l.index(i)]), i); 
    }
}